

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void hide_shlib_symbols(GlobalVars *gv)

{
  Symbol *pSVar1;
  Symbol **chain;
  Symbol *sym;
  int i;
  GlobalVars *gv_local;
  
  for (i = 0; i < 0x10000; i = i + 1) {
    chain = gv->symbols + i;
    while (pSVar1 = *chain, pSVar1 != (Symbol *)0x0) {
      if (((pSVar1->flags & 0x10) == 0) || ((pSVar1->flags & 2) != 0)) {
        chain = &pSVar1->glob_chain;
      }
      else {
        *chain = pSVar1->glob_chain;
        pSVar1->glob_chain = (Symbol *)0x0;
      }
    }
  }
  return;
}

Assistant:

void hide_shlib_symbols(struct GlobalVars *gv)
/* scan for all unreferenced SYMF_SHLIB symbols in the global symbol list
   and remove them - they have to be invisible for the file we create */
{
  int i;

  for (i=0; i<SYMHTABSIZE; i++) {
    struct Symbol *sym;
    struct Symbol **chain = &gv->symbols[i];

    while (sym = *chain) {
      if ((sym->flags & SYMF_SHLIB) && !(sym->flags & SYMF_REFERENCED)) {
        /* remove from global symbol list */
        *chain = sym->glob_chain;
        sym->glob_chain = NULL;
      }
      else
        chain = &sym->glob_chain;
    }        
  }
}